

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int saxParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *__filename;
  undefined8 *puVar2;
  undefined8 uVar3;
  char *__format;
  int iVar4;
  debugContext userData;
  
  nb_tests = nb_tests + 1;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fwrite("out of memory\n",0xe,1,_stderr);
    fatalError();
  }
  SAXdebug = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    fprintf(_stderr,"Failed to write to %s\n",__filename);
    free(__filename);
    return -1;
  }
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar2 = (undefined8 *)xmlCreateFileParserCtxt(filename);
    memcpy((void *)*puVar2,&emptySAXHandlerStruct,0x100);
    xmlCtxtUseOptions(puVar2,options);
    xmlParseDocument(puVar2);
    if (*(int *)(puVar2 + 3) != 0) {
      xmlFreeDoc(puVar2[2]);
      xmlFreeParserCtxt(puVar2);
LAB_00108dec:
      puVar2 = (undefined8 *)xmlCreateFileParserCtxt(filename);
      if (((uint)options >> 9 & 1) == 0) {
        memcpy((void *)*puVar2,&debugSAX2HandlerStruct,0x100);
      }
      else {
        memcpy((void *)*puVar2,&debugSAXHandlerStruct,0x100);
        options = options + -0x200;
      }
      iVar4 = 0;
      userData.filename = filename;
      userData.generalEntities = (xmlHashTablePtr)xmlHashCreate(0);
      userData.parameterEntities = (xmlHashTablePtr)xmlHashCreate(0);
      puVar2[1] = &userData;
      xmlCtxtUseOptions(puVar2,options);
      xmlParseDocument(puVar2);
      if (*(int *)(puVar2 + 3) == 0) {
        iVar4 = *(int *)(puVar2 + 0x11);
      }
      xmlHashFree(userData.generalEntities,hashFreeEntity);
      xmlHashFree(userData.parameterEntities,hashFreeEntity);
      xmlFreeDoc(puVar2[2]);
      xmlFreeParserCtxt(puVar2);
      goto LAB_00108eab;
    }
    iVar4 = *(int *)(puVar2 + 0x11);
    xmlFreeDoc(puVar2[2]);
    xmlFreeParserCtxt(puVar2);
    if (iVar4 == 0) goto LAB_00108dec;
    if (iVar4 == 0x1a) {
      fprintf((FILE *)SAXdebug,"xmlParseDocument returned error %d\n",0x1a);
      goto LAB_00108dec;
    }
    __format = "Failed to parse %s\n";
  }
  else {
    iVar4 = 0;
    uVar3 = htmlNewSAXParserCtxt(&emptySAXHandlerStruct,0);
    htmlCtxtReadFile(uVar3,filename,0,options);
    htmlFreeParserCtxt(uVar3);
    uVar3 = htmlNewSAXParserCtxt(&debugHTMLSAXHandlerStruct,0);
    htmlCtxtReadFile(uVar3,filename,0,options);
    htmlFreeParserCtxt(uVar3);
LAB_00108eab:
    fclose((FILE *)SAXdebug);
    iVar1 = compareFiles(__filename,result);
    if (iVar1 == 0) goto LAB_00108ec6;
    __format = "Got a difference for %s\n";
  }
  fprintf(_stderr,__format,filename);
  iVar4 = 1;
LAB_00108ec6:
  unlink(__filename);
  free(__filename);
  return iVar4;
}

Assistant:

static int
saxParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
             int options) {
    int ret;
    char *temp;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(emptySAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);
        memcpy(ctxt->sax, emptySAXHandler, sizeof(xmlSAXHandler));
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    if (ret == XML_ERR_UNDECLARED_ENTITY) {
        fprintf(SAXdebug, "xmlParseDocument returned error %d\n", ret);
        ret = 0;
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	ret = 1;
	goto done;
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(debugHTMLSAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        debugContext userData;
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);

        if (options & XML_PARSE_SAX1) {
            memcpy(ctxt->sax, debugSAXHandler, sizeof(xmlSAXHandler));
            options -= XML_PARSE_SAX1;
        } else {
            memcpy(ctxt->sax, debugSAX2Handler, sizeof(xmlSAXHandler));
        }
        userData.filename = filename;
        userData.generalEntities = xmlHashCreate(0);
        userData.parameterEntities = xmlHashCreate(0);
        ctxt->userData = &userData;
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlHashFree(userData.generalEntities, hashFreeEntity);
        xmlHashFree(userData.parameterEntities, hashFreeEntity);
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    fclose(SAXdebug);
    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

done:
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}